

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  int in_ECX;
  int in_EDX;
  IdxElement *in_RSI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  undefined1 in_stack_00000010;
  int mid;
  int hi;
  int lo;
  IdxElement tmp;
  IdxElement pivotkey;
  undefined4 in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff50c;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff518;
  undefined1 local_ad9;
  IdxElement *in_stack_fffffffffffff528;
  undefined7 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff537;
  undefined1 uVar1;
  IdxElement *in_stack_fffffffffffff538;
  IdxElement *pIVar2;
  undefined1 local_ab9;
  undefined1 local_aa9;
  undefined1 local_a99;
  undefined1 local_a89;
  undefined4 local_13c;
  undefined4 local_138;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffd4;
  uint size_00;
  int end_00;
  int iVar3;
  undefined4 local_4;
  
  size_00 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd4) & 0x1ffffff;
  if (in_ECX < in_EDX + 1) {
    local_4 = 0;
  }
  else if (in_ECX == in_EDX + 1) {
    local_4 = 1;
  }
  else {
    local_138 = in_R9D;
    if (in_R9D < in_EDX) {
      local_138 = in_EDX;
    }
    if (local_138 + in_R8D < in_ECX + -1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement
                ((IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement
                ((IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_13c = in_ECX + -1;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=
                ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                 (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      end_00 = local_138;
      iVar3 = local_13c;
      while( true ) {
        pIVar2 = in_RSI;
        if ((size_00 & 0x1000000) == 0) {
          while( true ) {
            local_aa9 = false;
            if (local_138 < iVar3) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)in_stack_fffffffffffff538,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530)
                         ,in_stack_fffffffffffff528);
              local_aa9 = boost::multiprecision::operator<=
                                    (in_stack_fffffffffffff518,
                                     (int *)CONCAT44(in_stack_fffffffffffff514,
                                                     in_stack_fffffffffffff510));
            }
            if (local_aa9 == false) break;
            local_138 = local_138 + 1;
          }
          while( true ) {
            local_ab9 = false;
            in_RSI = pIVar2;
            if (end_00 < local_13c) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)pIVar2,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530)
                         ,in_stack_fffffffffffff528);
              local_ab9 = boost::multiprecision::operator>
                                    (in_stack_fffffffffffff518,
                                     (int *)CONCAT44(in_stack_fffffffffffff514,
                                                     in_stack_fffffffffffff510));
              in_stack_fffffffffffff538 = pIVar2;
            }
            if (local_ab9 == false) break;
            local_13c = local_13c + -1;
            pIVar2 = in_RSI;
          }
        }
        else {
          while( true ) {
            local_a89 = false;
            if (local_138 < iVar3) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)in_stack_fffffffffffff538,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530)
                         ,in_stack_fffffffffffff528);
              local_a89 = boost::multiprecision::operator<
                                    (in_stack_fffffffffffff518,
                                     (int *)CONCAT44(in_stack_fffffffffffff514,
                                                     in_stack_fffffffffffff510));
            }
            if (local_a89 == false) break;
            local_138 = local_138 + 1;
          }
          while( true ) {
            local_a99 = false;
            if (end_00 < local_13c) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement
                        ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510)
                         ,(IdxElement *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)in_stack_fffffffffffff538,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530)
                         ,in_stack_fffffffffffff528);
              local_a99 = boost::multiprecision::operator>=
                                    (in_stack_fffffffffffff518,
                                     (int *)CONCAT44(in_stack_fffffffffffff514,
                                                     in_stack_fffffffffffff510));
            }
            if (local_a99 == false) break;
            local_13c = local_13c + -1;
          }
        }
        if (local_13c <= local_138) break;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=
                  ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=
                  ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=
                  ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        local_138 = local_138 + 1;
        local_13c = local_13c + -1;
      }
      if ((size_00 & 0x1000000) == 0) {
        while( true ) {
          local_ad9 = false;
          pIVar2 = in_RSI;
          if (end_00 < local_13c) {
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement
                      ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                       (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement
                      ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                       (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((IdxCompare *)in_stack_fffffffffffff538,
                       (IdxElement *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       in_stack_fffffffffffff528);
            local_ad9 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_RSI,
                                   (int *)CONCAT44(in_stack_fffffffffffff514,
                                                   in_stack_fffffffffffff510));
          }
          if (local_ad9 == false) break;
          local_13c = local_13c + -1;
          in_RSI = pIVar2;
        }
        if (local_13c == iVar3) {
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          local_13c = local_13c + -1;
        }
      }
      else {
        while( true ) {
          uVar1 = false;
          pIVar2 = in_RSI;
          if (local_138 < iVar3) {
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement
                      ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                       (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement
                      ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                       (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((IdxCompare *)in_stack_fffffffffffff538,
                       (IdxElement *)CONCAT17(uVar1,in_stack_fffffffffffff530),in_RSI);
            uVar1 = boost::multiprecision::operator>=
                              (in_stack_fffffffffffff518,
                               (int *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510))
            ;
          }
          if ((type_conflict5)uVar1 == false) break;
          local_138 = local_138 + 1;
          in_RSI = pIVar2;
        }
        if (local_138 == end_00) {
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=
                    ((IdxElement *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (IdxElement *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
          local_138 = local_138 + 1;
        }
      }
      if (local_13c - end_00 < in_R8D * 2) {
        if (local_138 - end_00 < in_R8D) {
          SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((IdxElement *)CONCAT44(in_EDX,iVar3),in_R8D,
                     (IdxCompare *)CONCAT44(size_00,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
          local_4 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                              (pIVar2,(IdxCompare *)CONCAT44(in_EDX,iVar3),in_R8D,end_00,size_00,
                               in_stack_ffffffffffffffd0,unaff_retaddr,
                               SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
        }
        else {
          SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((IdxElement *)CONCAT44(in_EDX,iVar3),in_R8D,
                     (IdxCompare *)CONCAT44(size_00,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
          local_4 = local_138 + -1;
        }
      }
      else {
        local_4 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                            (pIVar2,(IdxCompare *)CONCAT44(in_EDX,iVar3),in_R8D,end_00,size_00,
                             in_stack_ffffffffffffffd0,unaff_retaddr,
                             SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
      }
    }
    else {
      SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                ((IdxElement *)CONCAT44(in_EDX,in_ECX),in_R8D,
                 (IdxCompare *)
                 (CONCAT44(CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd4),
                           in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),in_stack_ffffffffffffffcc
                 ,(bool)in_stack_ffffffffffffffcb);
      local_4 = in_ECX + -1;
    }
  }
  return local_4;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}